

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O0

void __thiscall
TPZManVector<TPZCompElSide,_5>::Resize(TPZManVector<TPZCompElSide,_5> *this,int64_t newsize)

{
  undefined1 auVar1 [16];
  ostream *this_00;
  ulong uVar2;
  ulong uVar3;
  TPZCompElSide *pTVar4;
  TPZCompElSide *pTVar5;
  long in_RSI;
  TPZManVector<TPZCompElSide,_5> *in_RDI;
  int64_t i_1;
  TPZCompElSide *newstore;
  int64_t realsize;
  int64_t i;
  TPZCompElSide *local_70;
  long local_40;
  long local_18;
  
  if (in_RSI < 0) {
    this_00 = std::operator<<((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::ostream::flush();
  }
  else if (in_RSI != (in_RDI->super_TPZVec<TPZCompElSide>).fNElements) {
    if ((in_RDI->super_TPZVec<TPZCompElSide>).fNAlloc < in_RSI) {
      if (in_RSI < 6) {
        if ((in_RDI->super_TPZVec<TPZCompElSide>).fStore != in_RDI->fExtAlloc) {
          for (local_18 = 0; local_18 < (in_RDI->super_TPZVec<TPZCompElSide>).fNElements;
              local_18 = local_18 + 1) {
            pTVar4 = (in_RDI->super_TPZVec<TPZCompElSide>).fStore + local_18;
            in_RDI->fExtAlloc[local_18].fEl = pTVar4->fEl;
            in_RDI->fExtAlloc[local_18].fSide = pTVar4->fSide;
          }
          pTVar4 = (in_RDI->super_TPZVec<TPZCompElSide>).fStore;
          if (pTVar4 != (TPZCompElSide *)0x0) {
            operator_delete__(pTVar4);
          }
          (in_RDI->super_TPZVec<TPZCompElSide>).fStore = in_RDI->fExtAlloc;
        }
        (in_RDI->super_TPZVec<TPZCompElSide>).fNElements = in_RSI;
        (in_RDI->super_TPZVec<TPZCompElSide>).fNAlloc = 0;
      }
      else {
        uVar2 = ExpandSize(in_RDI,in_RSI);
        auVar1._8_8_ = 0;
        auVar1._0_8_ = uVar2;
        uVar3 = SUB168(auVar1 * ZEXT816(0x10),0);
        if (SUB168(auVar1 * ZEXT816(0x10),8) != 0) {
          uVar3 = 0xffffffffffffffff;
        }
        pTVar4 = (TPZCompElSide *)operator_new__(uVar3);
        if (uVar2 != 0) {
          local_70 = pTVar4;
          do {
            TPZCompElSide::TPZCompElSide(local_70);
            local_70 = local_70 + 1;
          } while (local_70 != pTVar4 + uVar2);
        }
        for (local_40 = 0; local_40 < (in_RDI->super_TPZVec<TPZCompElSide>).fNElements;
            local_40 = local_40 + 1) {
          pTVar5 = (in_RDI->super_TPZVec<TPZCompElSide>).fStore + local_40;
          pTVar4[local_40].fEl = pTVar5->fEl;
          pTVar4[local_40].fSide = pTVar5->fSide;
        }
        if (((in_RDI->super_TPZVec<TPZCompElSide>).fStore != in_RDI->fExtAlloc) &&
           (pTVar5 = (in_RDI->super_TPZVec<TPZCompElSide>).fStore, pTVar5 != (TPZCompElSide *)0x0))
        {
          operator_delete__(pTVar5);
        }
        (in_RDI->super_TPZVec<TPZCompElSide>).fStore = pTVar4;
        (in_RDI->super_TPZVec<TPZCompElSide>).fNElements = in_RSI;
        (in_RDI->super_TPZVec<TPZCompElSide>).fNAlloc = uVar2;
      }
    }
    else {
      (in_RDI->super_TPZVec<TPZCompElSide>).fNElements = in_RSI;
    }
  }
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
#endif

    if (newsize == this->fNElements)
        return;

    if (newsize <= this->fNAlloc) {
        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore
        if (this->fStore != fExtAlloc) {
            for (int64_t i = 0L; i < this->fNElements; i++) {
                fExtAlloc[i] = this->fStore[i];
            }
            delete [] this->fStore;
            this->fStore = fExtAlloc;
        }

        this->fNElements = newsize;
        this->fNAlloc = 0;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs

        int64_t realsize = ExpandSize(newsize);
        T *newstore = new T[realsize];

        for (int64_t i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        if (this->fStore != fExtAlloc)
            delete [] this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}